

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Combine<duckdb::KahanSumState,duckdb::DoubleSumOperation<duckdb::KahanAdd>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  undefined4 *puVar4;
  idx_t iVar5;
  undefined1 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (count != 0) {
    lVar1 = *(long *)(source + 0x20);
    lVar2 = *(long *)(target + 0x20);
    iVar5 = 0;
    do {
      pcVar3 = *(char **)(lVar1 + iVar5 * 8);
      puVar4 = *(undefined4 **)(lVar2 + iVar5 * 8);
      uVar6 = 1;
      if (*pcVar3 == '\0') {
        uVar6 = (undefined1)*puVar4;
      }
      *(undefined1 *)puVar4 = uVar6;
      dVar8 = *(double *)(puVar4 + 2) + (*(double *)(pcVar3 + 8) - *(double *)(puVar4 + 4));
      dVar9 = (dVar8 - *(double *)(puVar4 + 2)) -
              (*(double *)(pcVar3 + 8) - *(double *)(puVar4 + 4));
      *(double *)(puVar4 + 4) = dVar9;
      *(double *)(puVar4 + 2) = dVar8;
      dVar9 = *(double *)(pcVar3 + 0x10) - dVar9;
      dVar7 = dVar8 + dVar9;
      *(double *)(puVar4 + 4) = (dVar7 - dVar8) - dVar9;
      *(double *)(puVar4 + 2) = dVar7;
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}